

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

void mbedtls_mpi_core_exp_mod
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,mbedtls_mpi_uint *RR,mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint *T_00;
  size_t __n;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  mbedtls_mpi_uint mVar5;
  ulong uVar6;
  mbedtls_mpi_uint *pmVar7;
  ulong uVar8;
  size_t i;
  size_t sVar9;
  mbedtls_mpi_uint *B;
  bool bVar10;
  
  B = T + AN_limbs * 2;
  mVar5 = *N;
  lVar4 = ((int)mVar5 * 2 + 4U & 8) + mVar5;
  uVar3 = 0x40;
  do {
    lVar4 = (2 - lVar4 * mVar5) * lVar4;
    bVar10 = 0xf < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar10);
  T_00 = B + AN_limbs;
  mVar5 = -lVar4;
  __n = AN_limbs * 8;
  memset(T,0,__n);
  *T = 1;
  mbedtls_mpi_core_montmul(T,T,RR,AN_limbs,N,AN_limbs,mVar5,T_00);
  memcpy(T + AN_limbs,A,__n);
  memcpy(X,T,__n);
  uVar2 = 0;
  do {
    E_limbs = E_limbs - (uVar2 == 0);
    bVar10 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar10) {
      uVar2 = 0x3f;
    }
    mbedtls_mpi_core_montmul(X,X,X,AN_limbs,N,AN_limbs,mVar5,T_00);
    uVar1 = E[E_limbs];
    pmVar7 = T;
    uVar8 = 0;
    do {
      uVar6 = (uVar1 >> (uVar2 & 0x3f) & 1) != 0 ^ uVar8;
      uVar6 = (long)(-uVar6 | uVar6) >> 0x3f;
      if (pmVar7 != B && AN_limbs != 0) {
        sVar9 = 0;
        do {
          B[sVar9] = B[sVar9] & uVar6 | pmVar7[sVar9] & ~uVar6;
          sVar9 = sVar9 + 1;
        } while (AN_limbs != sVar9);
      }
      pmVar7 = pmVar7 + AN_limbs;
      bVar10 = uVar8 == 0;
      uVar8 = uVar8 + 1;
    } while (bVar10);
    mbedtls_mpi_core_montmul(X,X,B,AN_limbs,N,AN_limbs,mVar5,T_00);
  } while (E_limbs != 0 || uVar2 != 0);
  return;
}

Assistant:

void mbedtls_mpi_core_exp_mod(mbedtls_mpi_uint *X,
                              const mbedtls_mpi_uint *A,
                              const mbedtls_mpi_uint *N,
                              size_t AN_limbs,
                              const mbedtls_mpi_uint *E,
                              size_t E_limbs,
                              const mbedtls_mpi_uint *RR,
                              mbedtls_mpi_uint *T)
{
    const size_t wsize = exp_mod_get_window_size(E_limbs * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* This is how we will use the temporary storage T, which must have space
     * for table_limbs, select_limbs and (2 * AN_limbs + 1) for montmul. */
    const size_t table_limbs  = welem * AN_limbs;
    const size_t select_limbs = AN_limbs;

    /* Pointers to specific parts of the temporary working memory pool */
    mbedtls_mpi_uint *const Wtable  = T;
    mbedtls_mpi_uint *const Wselect = Wtable  +  table_limbs;
    mbedtls_mpi_uint *const temp    = Wselect + select_limbs;

    /*
     * Window precomputation
     */

    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N);

    /* Set Wtable[i] = A^(2^i) (in Montgomery representation) */
    exp_mod_precompute_window(A, N, AN_limbs,
                              mm, RR,
                              welem, Wtable, temp);

    /*
     * Fixed window exponentiation
     */

    /* X = 1 (in Montgomery presentation) initially */
    memcpy(X, Wtable, AN_limbs * ciL);

    /* We'll process the bits of E from most significant
     * (limb_index=E_limbs-1, E_bit_index=biL-1) to least significant
     * (limb_index=0, E_bit_index=0). */
    size_t E_limb_index = E_limbs;
    size_t E_bit_index = 0;
    /* At any given time, window contains window_bits bits from E.
     * window_bits can go up to wsize. */
    size_t window_bits = 0;
    mbedtls_mpi_uint window = 0;

    do {
        /* Square */
        mbedtls_mpi_core_montmul(X, X, X, AN_limbs, N, AN_limbs, mm, temp);

        /* Move to the next bit of the exponent */
        if (E_bit_index == 0) {
            --E_limb_index;
            E_bit_index = biL - 1;
        } else {
            --E_bit_index;
        }
        /* Insert next exponent bit into window */
        ++window_bits;
        window <<= 1;
        window |= (E[E_limb_index] >> E_bit_index) & 1;

        /* Clear window if it's full. Also clear the window at the end,
         * when we've finished processing the exponent. */
        if (window_bits == wsize ||
            (E_bit_index == 0 && E_limb_index == 0)) {
            /* Select Wtable[window] without leaking window through
             * memory access patterns. */
            mbedtls_mpi_core_ct_uint_table_lookup(Wselect, Wtable,
                                                  AN_limbs, welem, window);
            /* Multiply X by the selected element. */
            mbedtls_mpi_core_montmul(X, X, Wselect, AN_limbs, N, AN_limbs, mm,
                                     temp);
            window = 0;
            window_bits = 0;
        }
    } while (!(E_bit_index == 0 && E_limb_index == 0));
}